

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

wchar_t ignore_point(chunk_conflict *c,int *colors,loc_conflict grid)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  
  wVar2 = grid_to_i(grid,c->width);
  _Var1 = square_in_bounds(c,(loc)grid);
  wVar3 = L'\x01';
  if ((_Var1) && (colors[wVar2] == 0)) {
    _Var1 = square_ispassable(c,(loc)grid);
    wVar3 = L'\0';
    if (!_Var1) {
      _Var1 = square_isdoor(c,(loc)grid);
      wVar3 = (wchar_t)!_Var1;
    }
  }
  return wVar3;
}

Assistant:

static int ignore_point(struct chunk *c, int colors[], struct loc grid) {
	int n = grid_to_i(grid, c->width);

	if (!square_in_bounds(c, grid)) return true;
	if (colors[n]) return true;
	if (square_ispassable(c, grid)) return false;
	if (square_isdoor(c, grid)) return false;
	return true;
}